

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

int __thiscall
sqvector<long_long>::copy(sqvector<long_long> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  SQUnsignedInteger i;
  longlong *in_stack_ffffffffffffffe0;
  ulong uVar1;
  SQUnsignedInteger in_stack_ffffffffffffffe8;
  
  if (this->_size != 0) {
    in_stack_ffffffffffffffe8 = 0;
    resize((sqvector<long_long> *)dst,0,in_stack_ffffffffffffffe0);
  }
  if (this->_allocated < ((sqvector<long_long> *)dst)->_size) {
    _realloc((sqvector<long_long> *)dst,in_stack_ffffffffffffffe8);
  }
  for (uVar1 = 0; uVar1 < ((sqvector<long_long> *)dst)->_size; uVar1 = uVar1 + 1) {
    this->_vals[uVar1] = ((sqvector<long_long> *)dst)->_vals[uVar1];
  }
  this->_size = ((sqvector<long_long> *)dst)->_size;
  return (int)this;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }